

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerselect.c
# Opt level: O0

int is_valid_character(nh_roles_info *ri,int rolenum,int racenum,int gendnum,int alignnum)

{
  int local_34;
  int local_30;
  int ok;
  int l;
  int k;
  int j;
  int i;
  int alignnum_local;
  int gendnum_local;
  int racenum_local;
  int rolenum_local;
  nh_roles_info *ri_local;
  
  local_34 = 0;
  for (k = 0; k < ri->num_roles; k = k + 1) {
    if ((rolenum < 0) || (k == rolenum)) {
      for (l = 0; l < ri->num_races; l = l + 1) {
        if ((racenum < 0) || (l == racenum)) {
          for (ok = 0; ok < ri->num_genders; ok = ok + 1) {
            if ((gendnum < 0) || (ok == gendnum)) {
              for (local_30 = 0; local_30 < ri->num_aligns; local_30 = local_30 + 1) {
                if (((alignnum < 0) || (local_30 == alignnum)) &&
                   (ri->matrix
                    [((k * ri->num_races + l) * ri->num_genders + ok) * ri->num_aligns + local_30]
                    != '\0')) {
                  local_34 = local_34 + 1;
                }
              }
            }
          }
        }
      }
    }
  }
  return (int)(0 < local_34);
}

Assistant:

static int is_valid_character(const struct nh_roles_info *ri, int rolenum,
			      int racenum, int gendnum, int alignnum)
{
    int i, j, k, l, ok;
    
    ok = 0;
    for (i = 0; i < ri->num_roles; i++) {
	if (rolenum > ROLE_NONE && i != rolenum)
	    continue;
	
	for (j = 0; j < ri->num_races; j++) {
	    if (racenum > ROLE_NONE && j != racenum)
		continue;
	    
	    for (k = 0; k < ri->num_genders; k++) {
		if (gendnum > ROLE_NONE && k != gendnum)
		    continue;
		
		for (l = 0; l < ri->num_aligns; l++) {
		    if (alignnum > ROLE_NONE && l != alignnum)
			continue;
		    
		    if (ri->matrix[nh_cm_idx((*ri), i, j, k, l)])
			ok++;
		}
	    }
	}
    }
    
    return ok > 0;
}